

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_same_tangent(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  REF_STATUS RVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  REF_DBL tangent1 [3];
  REF_DBL tangent0 [3];
  REF_INT nodes [27];
  double local_e8 [4];
  double local_c8 [4];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  *allowed = 1;
  if (((remove < 0) || (pRVar2 = ref_cell->ref_adj, pRVar2->nnode <= remove)) ||
     (lVar10 = (long)pRVar2->first[(uint)remove], lVar10 == -1)) {
    return 0;
  }
  pRVar4 = pRVar2->item + lVar10;
  do {
    lVar8 = (long)ref_cell->size_per * (long)pRVar4->ref;
    if ((ref_cell->c2n[lVar8] != keep) && (ref_cell->c2n[lVar8 + 1] != keep)) {
      uVar5 = ref_cell_nodes(ref_cell,pRVar4->ref,local_a8);
      if (uVar5 != 0) {
        pcVar11 = "nodes";
        uVar9 = 0x454;
LAB_00189ae1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar9,"ref_collapse_edge_same_tangent",(ulong)uVar5,pcVar11);
        return uVar5;
      }
      if ((long)ref_cell->node_per < 1) {
LAB_00189a5b:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x45b,"ref_collapse_edge_same_tangent","other not found");
        return 1;
      }
      iVar6 = -1;
      lVar8 = 0;
      do {
        if (local_a8[lVar8] != remove) {
          iVar6 = local_a8[lVar8];
        }
        lVar8 = lVar8 + 1;
      } while (ref_cell->node_per != lVar8);
      if (iVar6 == -1) goto LAB_00189a5b;
      pRVar3 = pRVar1->real;
      lVar8 = 0;
      do {
        local_c8[lVar8] = pRVar3[(ulong)(uint)(remove * 0xf) + lVar8] - pRVar3[iVar6 * 0xf + lVar8];
        local_e8[lVar8] = pRVar3[keep * 0xf + lVar8] - pRVar3[iVar6 * 0xf + lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar5 = ref_math_normalize(local_c8);
      if (uVar5 != 0) {
        pcVar11 = "zero length orig quad";
        uVar9 = 0x462;
        goto LAB_00189ae1;
      }
      RVar7 = ref_math_normalize(local_e8);
      if ((RVar7 == 4) ||
         (local_c8[2] * local_e8[2] + local_c8[0] * local_e8[0] + local_c8[1] * local_e8[1] <
          pRVar1->same_normal_tol)) {
        *allowed = 0;
        return 0;
      }
    }
    pRVar4 = ref_cell->ref_adj->item;
    lVar10 = (long)pRVar4[(int)lVar10].next;
    if (lVar10 == -1) {
      return 0;
    }
    pRVar4 = pRVar4 + lVar10;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_tangent(REF_GRID ref_grid,
                                                  REF_INT keep, REF_INT remove,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell;
  REF_INT other, node, ixyz;
  REF_DBL tangent0[3], tangent1[3];
  REF_DBL dot;
  REF_STATUS status;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    /* a quad with keep and remove will be removed */
    if (keep == ref_cell_c2n(ref_cell, 0, cell) ||
        keep == ref_cell_c2n(ref_cell, 1, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    other = REF_EMPTY;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (nodes[node] != remove) {
        other = nodes[node];
      }
    }
    RAS(REF_EMPTY != other, "other not found");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      tangent0[ixyz] = ref_node_xyz(ref_node, ixyz, remove) -
                       ref_node_xyz(ref_node, ixyz, other);
      tangent1[ixyz] = ref_node_xyz(ref_node, ixyz, keep) -
                       ref_node_xyz(ref_node, ixyz, other);
    }
    RSS(ref_math_normalize(tangent0), "zero length orig quad");
    status = ref_math_normalize(tangent1);
    if (REF_DIV_ZERO == status) { /* new quad face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    dot = ref_math_dot(tangent0, tangent1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}